

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor0.c
# Opt level: O0

void floor0_free_look(vorbis_look_floor *i)

{
  vorbis_look_floor0 *look;
  vorbis_look_floor *i_local;
  
  if (i != (vorbis_look_floor *)0x0) {
    if (*(long *)((long)i + 8) != 0) {
      if (**(long **)((long)i + 8) != 0) {
        free((void *)**(undefined8 **)((long)i + 8));
      }
      if (*(long *)(*(long *)((long)i + 8) + 8) != 0) {
        free(*(void **)(*(long *)((long)i + 8) + 8));
      }
      free(*(void **)((long)i + 8));
    }
    memset(i,0,0x30);
    free(i);
  }
  return;
}

Assistant:

static void floor0_free_look(vorbis_look_floor *i){
  vorbis_look_floor0 *look=(vorbis_look_floor0 *)i;
  if(look){

    if(look->linearmap){

      if(look->linearmap[0])_ogg_free(look->linearmap[0]);
      if(look->linearmap[1])_ogg_free(look->linearmap[1]);

      _ogg_free(look->linearmap);
    }
    memset(look,0,sizeof(*look));
    _ogg_free(look);
  }
}